

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall
TestOutput::printEclipseErrorInFileOnLine(TestOutput *this,SimpleString *file,size_t lineNumber)

{
  char *pcVar1;
  size_t lineNumber_local;
  SimpleString *file_local;
  TestOutput *this_local;
  
  (*this->_vptr_TestOutput[0xb])(this,"\n");
  pcVar1 = SimpleString::asCharString(file);
  (*this->_vptr_TestOutput[0xb])(this,pcVar1);
  (*this->_vptr_TestOutput[0xb])(this,":");
  (*this->_vptr_TestOutput[0xd])(this,lineNumber);
  (*this->_vptr_TestOutput[0xb])(this,":");
  (*this->_vptr_TestOutput[0xb])(this," error:");
  return;
}

Assistant:

void TestOutput::printEclipseErrorInFileOnLine(SimpleString file, size_t lineNumber)
{
    print("\n");
    print(file.asCharString());
    print(":");
    print(lineNumber);
    print(":");
    print(" error:");
}